

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull.c
# Opt level: O0

void pull0_sock_recv(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  int iVar2;
  undefined8 *item;
  pull0_pipe *p;
  pull0_sock *s;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x38));
  item = (undefined8 *)nni_list_first((nni_list *)((long)arg + 8));
  if (item == (undefined8 *)0x0) {
    _Var1 = nni_aio_start(aio,pull0_cancel,arg);
    if (_Var1) {
      nni_aio_list_append((nni_list *)((long)arg + 0x20),aio);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x38));
    }
    else {
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x38));
    }
  }
  else {
    nni_list_remove((nni_list *)((long)arg + 8),item);
    iVar2 = nni_list_empty((nni_list *)((long)arg + 8));
    if (iVar2 != 0) {
      nni_pollable_clear((nni_pollable *)((long)arg + 0x60));
    }
    nni_aio_finish_msg(aio,(nni_msg *)item[2]);
    item[2] = 0;
    nni_pipe_recv((nni_pipe *)*item,(nni_aio *)(item + 3));
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x38));
  }
  return;
}

Assistant:

static void
pull0_sock_recv(void *arg, nni_aio *aio)
{
	pull0_sock *s = arg;
	pull0_pipe *p;

	nni_mtx_lock(&s->m);
	if ((p = nni_list_first(&s->pl)) == NULL) {

		if (!nni_aio_start(aio, pull0_cancel, s)) {
			nni_mtx_unlock(&s->m);
			return;
		}

		nni_aio_list_append(&s->rq, aio);
		nni_mtx_unlock(&s->m);
		return;
	}

	nni_list_remove(&s->pl, p);
	if (nni_list_empty(&s->pl)) {
		nni_pollable_clear(&s->readable);
	}
	nni_aio_finish_msg(aio, p->m);
	p->m = NULL;
	nni_pipe_recv(p->p, &p->aio);
	nni_mtx_unlock(&s->m);
}